

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O2

void M_Drawer(void)

{
  FFont *this;
  int iVar1;
  int iVar2;
  long lVar3;
  AActor *pAVar4;
  BYTE *string;
  uint uVar5;
  player_t *ppVar6;
  
  lVar3 = (long)consoleplayer;
  pAVar4 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + lVar3 * 0x54));
  uVar5 = 0;
  if (((pAVar4 != (AActor *)0x0) && (uVar5 = 0, screen->Accel2D == false)) &&
     ((gamestate == GS_TITLELEVEL || (gamestate == GS_LEVEL)))) {
    ppVar6 = (player_t *)(&players + lVar3 * 0x54);
    if (pAVar4->player != (player_t *)0x0) {
      ppVar6 = pAVar4->player;
    }
    uVar5 = (int)(ppVar6->BlendB * 255.0) & 0xffU |
            ((int)(ppVar6->BlendG * 255.0) & 0xffU) << 8 |
            ((int)(ppVar6->BlendR * 255.0) & 0xffU) << 0x10 | (int)(ppVar6->BlendA * 255.0) << 0x18;
  }
  if ((DMenu::CurrentMenu != (DMenu *)0x0) && (menuactive != MENU_Off)) {
    iVar1 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xb])();
    if ((char)iVar1 != '\0') {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xd])
                (screen,(ulong)uVar5);
    }
    (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[10])();
  }
  if ((show_outdated_iwad_warning == true) && (DrawOutdatedIWADWarning()::needDisplay == '\0')) {
    uVar5 = I_MSTime();
    if (DrawOutdatedIWADWarning()::startTime == '\0') {
      iVar1 = __cxa_guard_acquire(&DrawOutdatedIWADWarning()::startTime);
      if (iVar1 != 0) {
        DrawOutdatedIWADWarning()::startTime = uVar5;
        __cxa_guard_release(&DrawOutdatedIWADWarning()::startTime);
      }
    }
    this = SmallFont;
    if ((int)(uVar5 - DrawOutdatedIWADWarning()::startTime) < 10000) {
      string = (BYTE *)FStringTable::operator()(&GStrings,"MNU_OUTDATED_IWAD");
      iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      iVar2 = FFont::StringWidth(this,string);
      DCanvas::DrawText((DCanvas *)screen,this,(uint)(499 < (int)uVar5 % 1000) * 3 + 6,
                        (iVar1 - iVar2 * CleanXfac) / 2,this->FontHeight,(char *)string,0x40001393,1
                        ,0);
    }
    else {
      DrawOutdatedIWADWarning()::needDisplay = '\x01';
    }
  }
  return;
}

Assistant:

void M_Drawer (void) 
{
	player_t *player = &players[consoleplayer];
	AActor *camera = player->camera;
	PalEntry fade = 0;

	if (!screen->Accel2D && camera != NULL && (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL))
	{
		if (camera->player != NULL)
		{
			player = camera->player;
		}
		fade = PalEntry (BYTE(player->BlendA*255), BYTE(player->BlendR*255), BYTE(player->BlendG*255), BYTE(player->BlendB*255));
	}


	if (DMenu::CurrentMenu != NULL && menuactive != MENU_Off) 
	{
		if (DMenu::CurrentMenu->DimAllowed()) screen->Dim(fade);
		DMenu::CurrentMenu->Drawer();
	}

	DrawOutdatedIWADWarning();
}